

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void __thiscall anon_unknown.dwarf_14c80dc::SDLJoystick::~SDLJoystick(SDLJoystick *this)

{
  pointer puVar1;
  
  SDL_JoystickClose(this->joystick_);
  puVar1 = (this->hat_values_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1,(long)(this->hat_values_).
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar1);
    return;
  }
  return;
}

Assistant:

~SDLJoystick() {
			SDL_JoystickClose(joystick_);
		}